

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise_x86_avx512::forward
          (Eltwise_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  long lVar6;
  pointer pMVar7;
  pointer pMVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [64];
  int q;
  undefined1 (*pauVar12) [64];
  ulong uVar13;
  undefined1 (*pauVar14) [64];
  int iVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 in_ZMM3 [64];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->c;
  uVar17 = (ulong)uVar1;
  uVar9 = m->h * m->w * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar15 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var2 = this->_vptr_Eltwise_x86_avx512;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) == 0) {
      pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          pauVar11 = (undefined1 (*) [64])(m->cstep * uVar10 * m->elemsize + (long)m->data);
          pauVar12 = (undefined1 (*) [64])
                     (pMVar8[1].cstep * uVar10 * pMVar8[1].elemsize + (long)pMVar8[1].data);
          pauVar14 = (undefined1 (*) [64])
                     (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar9 < 0x10) {
            uVar16 = 0;
          }
          else {
            iVar15 = 0xf;
            do {
              auVar18 = vmulps_avx512f(*pauVar12,*pauVar11);
              *pauVar14 = auVar18;
              pauVar11 = pauVar11 + 1;
              pauVar12 = pauVar12 + 1;
              pauVar14 = pauVar14 + 1;
              iVar15 = iVar15 + 0x10;
              uVar16 = uVar9 & 0xfffffff0;
            } while (iVar15 < (int)uVar9);
          }
          uVar5 = uVar16 | 7;
          while ((int)uVar5 < (int)uVar9) {
            auVar3._4_4_ = *(float *)(*pauVar12 + 4) * *(float *)(*pauVar11 + 4);
            auVar3._0_4_ = *(float *)*pauVar12 * *(float *)*pauVar11;
            auVar3._8_4_ = *(float *)(*pauVar12 + 8) * *(float *)(*pauVar11 + 8);
            auVar3._12_4_ = *(float *)(*pauVar12 + 0xc) * *(float *)(*pauVar11 + 0xc);
            auVar3._16_4_ = *(float *)(*pauVar12 + 0x10) * *(float *)(*pauVar11 + 0x10);
            auVar3._20_4_ = *(float *)(*pauVar12 + 0x14) * *(float *)(*pauVar11 + 0x14);
            auVar3._24_4_ = *(float *)(*pauVar12 + 0x18) * *(float *)(*pauVar11 + 0x18);
            auVar3._28_4_ = *(undefined4 *)(*pauVar12 + 0x1c);
            *(undefined1 (*) [32])*pauVar14 = auVar3;
            pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
            pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x20);
            uVar5 = uVar16 + 0xf;
            uVar16 = uVar16 + 8;
          }
          uVar5 = uVar16 | 3;
          while ((int)uVar5 < (int)uVar9) {
            auVar22._0_4_ = *(float *)*pauVar12 * *(float *)*pauVar11;
            auVar22._4_4_ = *(float *)(*pauVar12 + 4) * *(float *)(*pauVar11 + 4);
            auVar22._8_4_ = *(float *)(*pauVar12 + 8) * *(float *)(*pauVar11 + 8);
            auVar22._12_4_ = *(float *)(*pauVar12 + 0xc) * *(float *)(*pauVar11 + 0xc);
            *(undefined1 (*) [16])*pauVar14 = auVar22;
            pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
            pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x10);
            uVar5 = uVar16 + 7;
            uVar16 = uVar16 + 4;
          }
          if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
            lVar6 = 0;
            do {
              *(float *)((long)*pauVar14 + lVar6 * 4) =
                   *(float *)(*pauVar12 + lVar6 * 4) * *(float *)(*pauVar11 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (uVar9 - uVar16 != (int)lVar6);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar17);
        pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (2 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7)) {
        uVar10 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar8 = pMVar8 + uVar10;
            uVar13 = 0;
            do {
              pauVar11 = (undefined1 (*) [64])
                         (pMVar8->cstep * uVar13 * pMVar8->elemsize + (long)pMVar8->data);
              pauVar12 = (undefined1 (*) [64])
                         (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
              uVar16 = 0;
              if (0xf < (int)uVar9) {
                iVar15 = 0xf;
                do {
                  auVar18 = vmulps_avx512f(*pauVar11,*pauVar12);
                  *pauVar12 = auVar18;
                  pauVar11 = pauVar11 + 1;
                  pauVar12 = pauVar12 + 1;
                  iVar15 = iVar15 + 0x10;
                  uVar16 = uVar9 & 0xfffffff0;
                } while (iVar15 < (int)uVar9);
              }
              uVar5 = uVar16 | 7;
              while ((int)uVar5 < (int)uVar9) {
                auVar4._4_4_ = *(float *)(*pauVar11 + 4) * *(float *)(*pauVar12 + 4);
                auVar4._0_4_ = *(float *)*pauVar11 * *(float *)*pauVar12;
                auVar4._8_4_ = *(float *)(*pauVar11 + 8) * *(float *)(*pauVar12 + 8);
                auVar4._12_4_ = *(float *)(*pauVar11 + 0xc) * *(float *)(*pauVar12 + 0xc);
                auVar4._16_4_ = *(float *)(*pauVar11 + 0x10) * *(float *)(*pauVar12 + 0x10);
                auVar4._20_4_ = *(float *)(*pauVar11 + 0x14) * *(float *)(*pauVar12 + 0x14);
                auVar4._24_4_ = *(float *)(*pauVar11 + 0x18) * *(float *)(*pauVar12 + 0x18);
                auVar4._28_4_ = *(undefined4 *)(*pauVar11 + 0x1c);
                *(undefined1 (*) [32])*pauVar12 = auVar4;
                pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
                pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
                uVar5 = uVar16 + 0xf;
                uVar16 = uVar16 + 8;
              }
              uVar5 = uVar16 | 3;
              while ((int)uVar5 < (int)uVar9) {
                auVar23._0_4_ = *(float *)*pauVar11 * *(float *)*pauVar12;
                auVar23._4_4_ = *(float *)(*pauVar11 + 4) * *(float *)(*pauVar12 + 4);
                auVar23._8_4_ = *(float *)(*pauVar11 + 8) * *(float *)(*pauVar12 + 8);
                auVar23._12_4_ = *(float *)(*pauVar11 + 0xc) * *(float *)(*pauVar12 + 0xc);
                *(undefined1 (*) [16])*pauVar12 = auVar23;
                pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
                pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
                uVar5 = uVar16 + 7;
                uVar16 = uVar16 + 4;
              }
              if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
                lVar6 = 0;
                do {
                  *(float *)(*pauVar12 + lVar6 * 4) =
                       *(float *)(*pauVar12 + lVar6 * 4) * *(float *)(*pauVar11 + lVar6 * 4);
                  lVar6 = lVar6 + 1;
                } while (uVar9 - uVar16 != (int)lVar6);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar17);
            pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
      }
    }
    if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) == 1) {
      pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)pp_Var2[-3]) == 0) {
        if (0 < (int)uVar1) {
          uVar10 = 0;
          do {
            pauVar11 = (undefined1 (*) [64])(m->cstep * uVar10 * m->elemsize + (long)m->data);
            pauVar12 = (undefined1 (*) [64])
                       (pMVar8[1].cstep * uVar10 * pMVar8[1].elemsize + (long)pMVar8[1].data);
            pauVar14 = (undefined1 (*) [64])
                       (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar9 < 0x10) {
              uVar16 = 0;
            }
            else {
              iVar15 = 0xf;
              do {
                auVar18 = vaddps_avx512f(*pauVar12,*pauVar11);
                *pauVar14 = auVar18;
                pauVar11 = pauVar11 + 1;
                pauVar12 = pauVar12 + 1;
                pauVar14 = pauVar14 + 1;
                iVar15 = iVar15 + 0x10;
                uVar16 = uVar9 & 0xfffffff0;
              } while (iVar15 < (int)uVar9);
            }
            uVar5 = uVar16 | 7;
            while ((int)uVar5 < (int)uVar9) {
              auVar27._0_4_ = *(float *)*pauVar12 + *(float *)*pauVar11;
              auVar27._4_4_ = *(float *)(*pauVar12 + 4) + *(float *)(*pauVar11 + 4);
              auVar27._8_4_ = *(float *)(*pauVar12 + 8) + *(float *)(*pauVar11 + 8);
              auVar27._12_4_ = *(float *)(*pauVar12 + 0xc) + *(float *)(*pauVar11 + 0xc);
              auVar27._16_4_ = *(float *)(*pauVar12 + 0x10) + *(float *)(*pauVar11 + 0x10);
              auVar27._20_4_ = *(float *)(*pauVar12 + 0x14) + *(float *)(*pauVar11 + 0x14);
              auVar27._24_4_ = *(float *)(*pauVar12 + 0x18) + *(float *)(*pauVar11 + 0x18);
              auVar27._28_4_ = *(float *)(*pauVar12 + 0x1c) + *(float *)(*pauVar11 + 0x1c);
              *(undefined1 (*) [32])*pauVar14 = auVar27;
              pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
              pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
              pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x20);
              uVar5 = uVar16 + 0xf;
              uVar16 = uVar16 + 8;
            }
            uVar5 = uVar16 | 3;
            while ((int)uVar5 < (int)uVar9) {
              auVar25._0_4_ = *(float *)*pauVar12 + *(float *)*pauVar11;
              auVar25._4_4_ = *(float *)(*pauVar12 + 4) + *(float *)(*pauVar11 + 4);
              auVar25._8_4_ = *(float *)(*pauVar12 + 8) + *(float *)(*pauVar11 + 8);
              auVar25._12_4_ = *(float *)(*pauVar12 + 0xc) + *(float *)(*pauVar11 + 0xc);
              *(undefined1 (*) [16])*pauVar14 = auVar25;
              pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
              pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
              pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x10);
              uVar5 = uVar16 + 7;
              uVar16 = uVar16 + 4;
            }
            if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
              lVar6 = 0;
              do {
                *(float *)((long)*pauVar14 + lVar6 * 4) =
                     *(float *)(*pauVar12 + lVar6 * 4) + *(float *)(*pauVar11 + lVar6 * 4);
                lVar6 = lVar6 + 1;
              } while (uVar9 - uVar16 != (int)lVar6);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar17);
          pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        }
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7)) {
          uVar10 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar8 = pMVar8 + uVar10;
              uVar13 = 0;
              do {
                pauVar11 = (undefined1 (*) [64])
                           (pMVar8->cstep * uVar13 * pMVar8->elemsize + (long)pMVar8->data);
                pauVar12 = (undefined1 (*) [64])
                           (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
                uVar16 = 0;
                if (0xf < (int)uVar9) {
                  iVar15 = 0xf;
                  do {
                    auVar18 = vaddps_avx512f(*pauVar11,*pauVar12);
                    *pauVar12 = auVar18;
                    pauVar11 = pauVar11 + 1;
                    pauVar12 = pauVar12 + 1;
                    iVar15 = iVar15 + 0x10;
                    uVar16 = uVar9 & 0xfffffff0;
                  } while (iVar15 < (int)uVar9);
                }
                uVar5 = uVar16 | 7;
                while ((int)uVar5 < (int)uVar9) {
                  auVar28._0_4_ = *(float *)*pauVar11 + *(float *)*pauVar12;
                  auVar28._4_4_ = *(float *)(*pauVar11 + 4) + *(float *)(*pauVar12 + 4);
                  auVar28._8_4_ = *(float *)(*pauVar11 + 8) + *(float *)(*pauVar12 + 8);
                  auVar28._12_4_ = *(float *)(*pauVar11 + 0xc) + *(float *)(*pauVar12 + 0xc);
                  auVar28._16_4_ = *(float *)(*pauVar11 + 0x10) + *(float *)(*pauVar12 + 0x10);
                  auVar28._20_4_ = *(float *)(*pauVar11 + 0x14) + *(float *)(*pauVar12 + 0x14);
                  auVar28._24_4_ = *(float *)(*pauVar11 + 0x18) + *(float *)(*pauVar12 + 0x18);
                  auVar28._28_4_ = *(float *)(*pauVar11 + 0x1c) + *(float *)(*pauVar12 + 0x1c);
                  *(undefined1 (*) [32])*pauVar12 = auVar28;
                  pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
                  pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
                  uVar5 = uVar16 + 0xf;
                  uVar16 = uVar16 + 8;
                }
                uVar5 = uVar16 | 3;
                while ((int)uVar5 < (int)uVar9) {
                  auVar26._0_4_ = *(float *)*pauVar11 + *(float *)*pauVar12;
                  auVar26._4_4_ = *(float *)(*pauVar11 + 4) + *(float *)(*pauVar12 + 4);
                  auVar26._8_4_ = *(float *)(*pauVar11 + 8) + *(float *)(*pauVar12 + 8);
                  auVar26._12_4_ = *(float *)(*pauVar11 + 0xc) + *(float *)(*pauVar12 + 0xc);
                  *(undefined1 (*) [16])*pauVar12 = auVar26;
                  pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
                  pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
                  uVar5 = uVar16 + 7;
                  uVar16 = uVar16 + 4;
                }
                if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
                  lVar6 = 0;
                  do {
                    *(float *)(*pauVar12 + lVar6 * 4) =
                         *(float *)(*pauVar12 + lVar6 * 4) + *(float *)(*pauVar11 + lVar6 * 4);
                    lVar6 = lVar6 + 1;
                  } while (uVar9 - uVar16 != (int)lVar6);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar17);
              pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar1) {
          uVar10 = 0;
          do {
            pauVar11 = (undefined1 (*) [64])(m->cstep * uVar10 * m->elemsize + (long)m->data);
            pauVar12 = (undefined1 (*) [64])
                       (pMVar8[1].cstep * uVar10 * pMVar8[1].elemsize + (long)pMVar8[1].data);
            pauVar14 = (undefined1 (*) [64])
                       (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
            uVar13 = **(ulong **)(&this->field_0xd8 + (long)pp_Var2[-3]);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar13;
            auVar22 = vmovshdup_avx(auVar24);
            if ((int)uVar9 < 0x10) {
              uVar16 = 0;
            }
            else {
              auVar18 = vbroadcastss_avx512f(auVar24);
              in_ZMM3 = vbroadcastsd_avx512f(auVar22);
              iVar15 = 0xf;
              do {
                auVar19 = vmulps_avx512f(auVar18,*pauVar11);
                auVar19 = vfmadd231ps_avx512f(auVar19,in_ZMM3,*pauVar12);
                *pauVar14 = auVar19;
                pauVar11 = pauVar11 + 1;
                pauVar12 = pauVar12 + 1;
                pauVar14 = pauVar14 + 1;
                iVar15 = iVar15 + 0x10;
                uVar16 = uVar9 & 0xfffffff0;
              } while (iVar15 < (int)uVar9);
            }
            fVar20 = (float)uVar13;
            if ((int)(uVar16 | 7) < (int)uVar9) {
              auVar31._0_8_ = auVar22._0_8_;
              auVar31._8_8_ = auVar31._0_8_;
              auVar31._16_8_ = auVar31._0_8_;
              auVar31._24_8_ = auVar31._0_8_;
              uVar5 = uVar16;
              do {
                auVar18._0_4_ = fVar20 * *(float *)*pauVar11;
                auVar18._4_4_ = fVar20 * *(float *)(*pauVar11 + 4);
                auVar18._8_4_ = fVar20 * *(float *)(*pauVar11 + 8);
                auVar18._12_4_ = fVar20 * *(float *)(*pauVar11 + 0xc);
                auVar18._16_4_ = fVar20 * *(float *)(*pauVar11 + 0x10);
                auVar18._20_4_ = fVar20 * *(float *)(*pauVar11 + 0x14);
                auVar18._28_36_ = in_ZMM3._28_36_;
                auVar18._24_4_ = fVar20 * *(float *)(*pauVar11 + 0x18);
                auVar22 = vfmadd231ps_fma(auVar18._0_32_,auVar31,*(undefined1 (*) [32])*pauVar12);
                in_ZMM3 = ZEXT1664(auVar22);
                *(undefined1 (*) [32])*pauVar14 = ZEXT1632(auVar22);
                pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
                pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
                pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x20);
                uVar16 = uVar5 + 8;
                iVar15 = uVar5 + 0xf;
                uVar5 = uVar16;
              } while (iVar15 < (int)uVar9);
            }
            if ((int)(uVar16 | 3) < (int)uVar9) {
              auVar22 = vshufps_avx(auVar24,auVar24,0x55);
              uVar5 = uVar16;
              do {
                auVar33._0_4_ = fVar20 * *(float *)*pauVar11;
                auVar33._4_4_ = fVar20 * *(float *)(*pauVar11 + 4);
                auVar33._8_4_ = fVar20 * *(float *)(*pauVar11 + 8);
                auVar33._12_4_ = fVar20 * *(float *)(*pauVar11 + 0xc);
                auVar23 = vfmadd231ps_fma(auVar33,auVar22,*(undefined1 (*) [16])*pauVar12);
                in_ZMM3 = ZEXT1664(auVar23);
                *(undefined1 (*) [16])*pauVar14 = auVar23;
                pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
                pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
                pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x10);
                uVar16 = uVar5 + 4;
                iVar15 = uVar5 + 7;
                uVar5 = uVar16;
              } while (iVar15 < (int)uVar9);
            }
            if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
              lVar6 = 0;
              do {
                auVar22 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar11 + lVar6 * 4)),
                                        ZEXT416(*(uint *)(*pauVar12 + lVar6 * 4)),0x10);
                auVar29._0_4_ = auVar22._0_4_ * fVar20;
                auVar29._4_4_ = auVar22._4_4_ * (float)(uVar13 >> 0x20);
                auVar29._8_4_ = auVar22._8_4_ * 0.0;
                auVar29._12_4_ = auVar22._12_4_ * 0.0;
                auVar22 = vhaddps_avx(auVar29,auVar29);
                *(int *)((long)*pauVar14 + lVar6 * 4) = auVar22._0_4_;
                lVar6 = lVar6 + 1;
              } while (uVar9 - uVar16 != (int)lVar6);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar17);
          pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        }
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7)) {
          pp_Var2 = this->_vptr_Eltwise_x86_avx512;
          uVar10 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar8 = pMVar8 + uVar10;
              uVar13 = 0;
              do {
                pauVar11 = (undefined1 (*) [64])
                           (pMVar8->cstep * uVar13 * pMVar8->elemsize + (long)pMVar8->data);
                pauVar12 = (undefined1 (*) [64])
                           (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
                auVar18 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)(*(long *)(&this->field_0xd8 +
                                                                (long)pp_Var2[-3]) + uVar10 * 4)));
                uVar16 = 0;
                if (0xf < (int)uVar9) {
                  iVar15 = 0xf;
                  do {
                    auVar19 = vfmadd213ps_avx512f(*pauVar11,auVar18,*pauVar12);
                    *pauVar12 = auVar19;
                    pauVar11 = pauVar11 + 1;
                    pauVar12 = pauVar12 + 1;
                    iVar15 = iVar15 + 0x10;
                    uVar16 = uVar9 & 0xfffffff0;
                  } while (iVar15 < (int)uVar9);
                }
                uVar21 = auVar18._0_4_;
                if ((int)(uVar16 | 7) < (int)uVar9) {
                  auVar32._4_4_ = uVar21;
                  auVar32._0_4_ = uVar21;
                  auVar32._8_4_ = uVar21;
                  auVar32._12_4_ = uVar21;
                  auVar32._16_4_ = uVar21;
                  auVar32._20_4_ = uVar21;
                  auVar32._24_4_ = uVar21;
                  auVar32._28_4_ = uVar21;
                  uVar5 = uVar16;
                  do {
                    auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])*pauVar11,auVar32,
                                              *(undefined1 (*) [32])*pauVar12);
                    *(undefined1 (*) [32])*pauVar12 = ZEXT1632(auVar22);
                    pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
                    pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
                    uVar16 = uVar5 + 8;
                    iVar15 = uVar5 + 0xf;
                    uVar5 = uVar16;
                  } while (iVar15 < (int)uVar9);
                }
                if ((int)(uVar16 | 3) < (int)uVar9) {
                  auVar30._4_4_ = uVar21;
                  auVar30._0_4_ = uVar21;
                  auVar30._8_4_ = uVar21;
                  auVar30._12_4_ = uVar21;
                  uVar5 = uVar16;
                  do {
                    auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar11,auVar30,
                                              *(undefined1 (*) [16])*pauVar12);
                    *(undefined1 (*) [16])*pauVar12 = auVar22;
                    pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
                    pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
                    uVar16 = uVar5 + 4;
                    iVar15 = uVar5 + 7;
                    uVar5 = uVar16;
                  } while (iVar15 < (int)uVar9);
                }
                if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
                  lVar6 = 0;
                  do {
                    auVar22 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar11 + lVar6 * 4)),
                                              auVar18._0_16_,
                                              ZEXT416(*(uint *)(*pauVar12 + lVar6 * 4)));
                    *(int *)(*pauVar12 + lVar6 * 4) = auVar22._0_4_;
                    lVar6 = lVar6 + 1;
                  } while (uVar9 - uVar16 != (int)lVar6);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar17);
              pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar15 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx512[-3]) == 2) {
      pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          pauVar11 = (undefined1 (*) [64])(m->cstep * uVar10 * m->elemsize + (long)m->data);
          pauVar12 = (undefined1 (*) [64])
                     (pMVar8[1].cstep * uVar10 * pMVar8[1].elemsize + (long)pMVar8[1].data);
          pauVar14 = (undefined1 (*) [64])
                     (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar9 < 0x10) {
            uVar16 = 0;
          }
          else {
            iVar15 = 0xf;
            do {
              auVar18 = vmaxps_avx512f(*pauVar11,*pauVar12);
              *pauVar14 = auVar18;
              pauVar11 = pauVar11 + 1;
              pauVar12 = pauVar12 + 1;
              pauVar14 = pauVar14 + 1;
              iVar15 = iVar15 + 0x10;
              uVar16 = uVar9 & 0xfffffff0;
            } while (iVar15 < (int)uVar9);
          }
          uVar5 = uVar16 | 7;
          while ((int)uVar5 < (int)uVar9) {
            auVar3 = vmaxps_avx(*(undefined1 (*) [32])*pauVar11,*(undefined1 (*) [32])*pauVar12);
            *(undefined1 (*) [32])*pauVar14 = auVar3;
            pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
            pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x20);
            uVar5 = uVar16 + 0xf;
            uVar16 = uVar16 + 8;
          }
          uVar5 = uVar16 | 3;
          while ((int)uVar5 < (int)uVar9) {
            auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar11,*(undefined1 (*) [16])*pauVar12);
            *(undefined1 (*) [16])*pauVar14 = auVar22;
            pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
            pauVar14 = (undefined1 (*) [64])((long)*pauVar14 + 0x10);
            uVar5 = uVar16 + 7;
            uVar16 = uVar16 + 4;
          }
          if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
            lVar6 = 0;
            do {
              auVar22 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar12 + lVar6 * 4)),
                                   ZEXT416(*(uint *)(*pauVar11 + lVar6 * 4)));
              *(int *)((long)*pauVar14 + lVar6 * 4) = auVar22._0_4_;
              lVar6 = lVar6 + 1;
            } while (uVar9 - uVar16 != (int)lVar6);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar17);
        pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      iVar15 = 0;
      if (2 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7)) {
        uVar10 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar8 = pMVar8 + uVar10;
            uVar13 = 0;
            do {
              pauVar11 = (undefined1 (*) [64])
                         (pMVar8->cstep * uVar13 * pMVar8->elemsize + (long)pMVar8->data);
              pauVar12 = (undefined1 (*) [64])
                         (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
              uVar16 = 0;
              if (0xf < (int)uVar9) {
                iVar15 = 0xf;
                do {
                  auVar18 = vmaxps_avx512f(*pauVar12,*pauVar11);
                  *pauVar12 = auVar18;
                  pauVar11 = pauVar11 + 1;
                  pauVar12 = pauVar12 + 1;
                  iVar15 = iVar15 + 0x10;
                  uVar16 = uVar9 & 0xfffffff0;
                } while (iVar15 < (int)uVar9);
              }
              uVar5 = uVar16 | 7;
              while ((int)uVar5 < (int)uVar9) {
                auVar3 = vmaxps_avx(*(undefined1 (*) [32])*pauVar12,*(undefined1 (*) [32])*pauVar11)
                ;
                *(undefined1 (*) [32])*pauVar12 = auVar3;
                pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
                pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
                uVar5 = uVar16 + 0xf;
                uVar16 = uVar16 + 8;
              }
              uVar5 = uVar16 | 3;
              while ((int)uVar5 < (int)uVar9) {
                auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar12,*(undefined1 (*) [16])*pauVar11
                                    );
                *(undefined1 (*) [16])*pauVar12 = auVar22;
                pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
                pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
                uVar5 = uVar16 + 7;
                uVar16 = uVar16 + 4;
              }
              if (uVar9 - uVar16 != 0 && (int)uVar16 <= (int)uVar9) {
                lVar6 = 0;
                do {
                  auVar22 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar12 + lVar6 * 4)),
                                       ZEXT416(*(uint *)(*pauVar11 + lVar6 * 4)));
                  *(int *)(*pauVar12 + lVar6 * 4) = auVar22._0_4_;
                  lVar6 = lVar6 + 1;
                } while (uVar9 - uVar16 != (int)lVar6);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar17);
            pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)(((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
        iVar15 = 0;
      }
    }
  }
  return iVar15;
}

Assistant:

int Eltwise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}